

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<std::array<tinyusdz::value::half,4ul>>
          (Attribute *this,double t,array<tinyusdz::value::half,_4UL> *dst,
          TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_2a;
  
  if (dst == (array<tinyusdz::value::half,_4UL> *)0x0) {
    return false;
  }
  if (((!NAN(t)) ||
      ((((this->_var)._blocked == false &&
        (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar3 = (*pvVar1->type_id)(), uVar3 == 0 ||
        ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))))) ||
     (primvar::PrimVar::get_value<std::array<tinyusdz::value::half,4ul>>(&local_2a,&this->_var),
     local_2a.has_value_ == false)) {
    if ((this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,4ul>>
                        (&this->_var,t,tinterp,dst);
      return bVar2;
    }
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,4ul>>(&local_2a,&this->_var);
    if (local_2a.has_value_ == false) {
      return false;
    }
  }
  *(storage_t<std::array<tinyusdz::value::half,_4UL>_> *)dst->_M_elems = local_2a.contained;
  return true;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }